

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-test.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  FILE *pFVar3;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  char *local_1040;
  state_t state;
  size_t len;
  char buffer [4096];
  telnet_t *telnet;
  FILE *fh;
  char **argv_local;
  int argc_local;
  
  local_1040 = (char *)0x0;
  state.expected = (char *)0x0;
  if (argc == 3) {
    pFVar3 = fopen(argv[2],"rt");
    pFVar1 = _stderr;
    if (pFVar3 == (FILE *)0x0) {
      pcVar6 = argv[2];
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar1,"Failed to open %s: %s\n",pcVar6,pcVar5);
      argv_local._4_4_ = 2;
    }
    else {
      while (pcVar6 = fgets((char *)&len,0x1000,pFVar3), pcVar6 != (char *)0x0) {
        local_1040 = append(local_1040,(char *)&len);
      }
      fclose(pFVar3);
      pFVar3 = fopen(argv[1],"rt");
      pFVar1 = _stderr;
      if (pFVar3 == (FILE *)0x0) {
        pcVar6 = argv[1];
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(pFVar1,"Failed to open %s: %s\n",pcVar6,pcVar5);
        argv_local._4_4_ = 3;
      }
      else {
        buffer._4088_8_ = telnet_init(telopts,event_print,'\0',&local_1040);
        pFVar1 = _stderr;
        if ((telnet_t *)buffer._4088_8_ == (telnet_t *)0x0) {
          piVar4 = __errno_location();
          pcVar6 = strerror(*piVar4);
          fprintf(pFVar1,"Failed to initialize libtelnet: %s\n",pcVar6);
          fclose(pFVar3);
          argv_local._4_4_ = 4;
        }
        else {
          while( true ) {
            pcVar6 = fgets((char *)&len,0x1000,pFVar3);
            bVar7 = false;
            if (pcVar6 != (char *)0x0) {
              iVar2 = strcmp((char *)&len,"%%\n");
              bVar7 = iVar2 != 0;
            }
            if (!bVar7) break;
            if ((char)len != '#') {
              state.actual = (char *)strlen((char *)&len);
              decode((char *)&len,(size_t *)&state.actual);
              telnet_recv((telnet_t *)buffer._4088_8_,(char *)&len,(size_t)state.actual);
            }
          }
          fclose(pFVar3);
          iVar2 = strcmp(state.expected,local_1040);
          if (iVar2 == 0) {
            telnet_free((telnet_t *)buffer._4088_8_);
            free(local_1040);
            free(state.expected);
            argv_local._4_4_ = 0;
          }
          else {
            fprintf(_stderr,"Expected:\n%s\n\nActual:\n%s\n",local_1040,state.expected);
            argv_local._4_4_ = 5;
          }
        }
      }
    }
  }
  else {
    fprintf(_stderr,"Usage: telnet-test [test file] [expected outline]\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
	FILE *fh;
	telnet_t *telnet;
	char buffer[4096];
	size_t len;
	state_t state;

	state.expected = NULL;
	state.actual = NULL;

	/* check for a requested input file */
	if (argc != 3) {
		fprintf(stderr, "Usage: telnet-test [test file] [expected outline]\n");
		return 1;
	}

	/* load expected input file */
	if ((fh = fopen(argv[2], "rt")) == NULL) {
		fprintf(stderr, "Failed to open %s: %s\n",
				argv[2], strerror(errno));
		return 2;
	}

	while (fgets(buffer, sizeof(buffer), fh) != NULL) {
		state.expected = append(state.expected, buffer);
	}

	fclose(fh);

	/* open input file file */
	if ((fh = fopen(argv[1], "rt")) == NULL) {
		fprintf(stderr, "Failed to open %s: %s\n",
				argv[1], strerror(errno));
		return 3;
	}

	/* create telnet parser instance */
	if ((telnet = telnet_init(telopts, event_print, 0,
			&state)) == 0) {
		fprintf(stderr, "Failed to initialize libtelnet: %s\n",
				strerror(errno));
		fclose(fh);
		return 4;
	}

	/* read input until we hit EOF or marker */
	while (fgets(buffer, sizeof(buffer), fh) != NULL && strcmp(buffer, "%%\n") != 0) {
		if (buffer[0] != '#') {
			len = strlen(buffer);
			decode(buffer, &len);
			telnet_recv(telnet, buffer, len);
		}
	}

	fclose(fh);

	/* compare expected and actual output */
	if (strcmp(state.actual, state.expected) != 0) {
		fprintf(stderr, "Expected:\n%s\n\nActual:\n%s\n", state.expected, state.actual);
		return 5;
	}

	/* clean up */
	telnet_free(telnet);
	free(state.expected);
	free(state.actual);

	return 0;
}